

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idaa_io.c
# Opt level: O3

int IDAGetAdjCurrentCheckPoint(void *ida_mem,void **addr)

{
  int line;
  int iVar1;
  int error_code;
  char *msgfmt;
  
  if (ida_mem == (void *)0x0) {
    msgfmt = "ida_mem = NULL illegal.";
    iVar1 = -0x14;
    ida_mem = (IDAMem)0x0;
    error_code = -0x14;
    line = 0x35d;
  }
  else {
    if (*(int *)((long)ida_mem + 0x848) != 0) {
      *addr = *(void **)(*(long *)((long)ida_mem + 0x840) + 0x58);
      return 0;
    }
    msgfmt = "Illegal attempt to call before calling IDAadjInit.";
    iVar1 = -0x65;
    error_code = -0x65;
    line = 0x366;
  }
  IDAProcessError((IDAMem)ida_mem,error_code,line,"IDAGetAdjCurrentCheckPoint",
                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idaa_io.c"
                  ,msgfmt);
  return iVar1;
}

Assistant:

int IDAGetAdjCurrentCheckPoint(void* ida_mem, void** addr)
{
  IDAMem IDA_mem;
  IDAadjMem IDAADJ_mem;

  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDA_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSGAM_NULL_IDAMEM);
    return (IDA_MEM_NULL);
  }
  IDA_mem = (IDAMem)ida_mem;

  /* Is ASA initialized? */
  if (IDA_mem->ida_adjMallocDone == SUNFALSE)
  {
    IDAProcessError(IDA_mem, IDA_NO_ADJ, __LINE__, __func__, __FILE__,
                    MSGAM_NO_ADJ);
    return (IDA_NO_ADJ);
  }
  IDAADJ_mem = IDA_mem->ida_adj_mem;

  *addr = (void*)IDAADJ_mem->ia_ckpntData;

  return (IDA_SUCCESS);
}